

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qladisp.cpp
# Opt level: O0

bool CollectFileConvert(char *inFilename,char *outFilename)

{
  byte bVar1;
  ostream *poVar2;
  void *pvVar3;
  uint local_43c;
  undefined1 auStack_438 [4];
  quadlet_t value;
  ofstream outFile;
  char local_228 [8];
  ifstream inFile;
  char *outFilename_local;
  char *inFilename_local;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"Converting data collection file ");
  poVar2 = std::operator<<(poVar2,inFilename);
  poVar2 = std::operator<<(poVar2," to ");
  poVar2 = std::operator<<(poVar2,outFilename);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ifstream::ifstream(local_228,inFilename,_S_bin);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to open input data collection file ");
    poVar2 = std::operator<<(poVar2,inFilename);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    inFilename_local._7_1_ = false;
  }
  else {
    std::ofstream::ofstream(auStack_438,outFilename,_S_trunc);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to open output data collection file ");
      poVar2 = std::operator<<(poVar2,outFilename);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      inFilename_local._7_1_ = false;
    }
    else {
      while (bVar1 = std::ios::good(), (bVar1 & 1) != 0) {
        std::istream::read(local_228,(long)&local_43c);
        pvVar3 = (void *)std::ostream::operator<<(auStack_438,std::dec);
        poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_43c >> 0x1f);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_43c >> 0x1e & 1);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_43c & 0x3fff0000) >> 0x10);
        poVar2 = std::operator<<(poVar2,", ");
        pvVar3 = (void *)std::ostream::operator<<(poVar2,local_43c & 0xffff);
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      }
      std::ifstream::close();
      std::ofstream::close();
      inFilename_local._7_1_ = true;
    }
    std::ofstream::~ofstream(auStack_438);
  }
  std::ifstream::~ifstream(local_228);
  return inFilename_local._7_1_;
}

Assistant:

bool CollectFileConvert(const char *inFilename, const char *outFilename)
{
    std::cerr << "Converting data collection file " << inFilename << " to " << outFilename << std::endl;
    std::ifstream inFile(inFilename, std::ifstream::binary);
    if (!inFile.good()) {
        std::cerr << "Failed to open input data collection file " << inFilename << std::endl;
        return false;
    }
    std::ofstream outFile(outFilename, std::ofstream::trunc);
    if (!outFile.good()) {
        std::cerr << "Failed to open output data collection file " << outFilename << std::endl;
        return false;
    }
    quadlet_t value;
    while (inFile.good()) {
        inFile.read(reinterpret_cast<char *>(&value), sizeof(quadlet_t));
        outFile << std::dec
                << ((value&0x80000000)>>31) << ", "    // type (0->commanded current, 1-> measured current)
                << ((value&0x40000000)>>30) << ", "    // timer overflow
                << ((value&0x3FFF0000)>>16) << ", "    // timer (14-bits)
                << (value&0x0000FFFF)                  // data
                << std::endl;
    }
    inFile.close();
    outFile.close();
    return true;
}